

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<std::pair<int,int>>::emplace<int&,int&>
          (QPodArrayOps<std::pair<int,_int>_> *this,qsizetype i,int *args,int *args_1)

{
  bool bVar1;
  qsizetype qVar2;
  pair<int,_int> *ppVar3;
  int *in_RCX;
  int *in_RDX;
  QArrayDataPointer<std::pair<int,_int>_> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  pair<int,_int> *where;
  GrowthPosition pos;
  bool detach;
  pair<int,_int> tmp;
  QArrayDataPointer<std::pair<int,_int>_> *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 uVar5;
  GrowthPosition where_00;
  pair<int,_int> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QArrayDataPointer<std::pair<int,_int>_>::needsDetach(in_stack_ffffffffffffffc0);
  uVar5 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffcc);
  if (!bVar1) {
    if ((in_RSI == *(QArrayDataPointer<std::pair<int,_int>_> **)(in_RDI + 0x10)) &&
       (qVar2 = QArrayDataPointer<std::pair<int,_int>_>::freeSpaceAtEnd
                          ((QArrayDataPointer<std::pair<int,_int>_> *)
                           CONCAT44(uVar5,in_stack_ffffffffffffffc8)), qVar2 != 0)) {
      ppVar3 = QArrayDataPointer<std::pair<int,_int>_>::end(in_stack_ffffffffffffffc0);
      std::pair<int,_int>::pair<int_&,_int_&,_true>(ppVar3,in_RDX,in_RCX);
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      goto LAB_008a1316;
    }
    if ((in_RSI == (QArrayDataPointer<std::pair<int,_int>_> *)0x0) &&
       (qVar2 = QArrayDataPointer<std::pair<int,_int>_>::freeSpaceAtBegin
                          ((QArrayDataPointer<std::pair<int,_int>_> *)
                           CONCAT44(uVar5,in_stack_ffffffffffffffc8)), qVar2 != 0)) {
      ppVar3 = QArrayDataPointer<std::pair<int,_int>_>::begin
                         ((QArrayDataPointer<std::pair<int,_int>_> *)0x8a1257);
      std::pair<int,_int>::pair<int_&,_int_&,_true>(ppVar3 + -1,in_RDX,in_RCX);
      *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + -8;
      *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
      goto LAB_008a1316;
    }
  }
  local_10 = (pair<int,_int>)&DAT_aaaaaaaaaaaaaaaa;
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_10,in_RDX,in_RCX);
  where_00 = (GrowthPosition)((ulong)in_RDX >> 0x20);
  uVar4 = 0;
  if ((*(long *)(in_RDI + 0x10) != 0) && (in_RSI == (QArrayDataPointer<std::pair<int,_int>_> *)0x0))
  {
    uVar4 = 1;
  }
  QArrayDataPointer<std::pair<int,_int>_>::detachAndGrow
            (in_RSI,where_00,(qsizetype)in_RCX,(pair<int,_int> **)CONCAT44(uVar5,uVar4),
             in_stack_ffffffffffffffc0);
  ppVar3 = QPodArrayOps<std::pair<int,_int>_>::createHole
                     ((QPodArrayOps<std::pair<int,_int>_> *)in_RSI,where_00,(qsizetype)in_RCX,
                      CONCAT44(uVar5,uVar4));
  *ppVar3 = local_10;
LAB_008a1316:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }